

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O1

void __thiscall HdmiCecAnalyzerResults::GenOperandBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string dataStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GetNumberString_abi_cxx11_(&local_30,this,*(U64 *)(frame + 0x10),8);
  if (this->mTabular == false) {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"D","");
    AnalyzerResults::AddResultString
              ((char *)this,local_50._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Data","");
    AnalyzerResults::AddResultString
              ((char *)this,local_50._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  std::operator+(&local_50,"Data ",&local_30);
  AnalyzerResults::AddResultString
            ((char *)this,local_50._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenOperandBubble( const Frame& frame )
{
    std::string dataStr = GetNumberString( frame.mData1, 8 );

    if( !mTabular )
    {
        AddResult( "D" );
        AddResult( "Data" );
    }
    AddResult( "Data " + dataStr );
}